

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ThreadSafeArena::ThreadSafeArena
          (ThreadSafeArena *this,void *mem,size_t size,AllocationPolicy *policy)

{
  ArenaBlock *pAVar1;
  AllocationPolicy *policy_local;
  size_t size_local;
  void *mem_local;
  ThreadSafeArena *this_local;
  
  this->tag_and_id_ = 0;
  TaggedAllocationPolicyPtr::TaggedAllocationPolicyPtr(&this->alloc_policy_);
  absl::lts_20240722::Mutex::Mutex(&this->mutex_);
  std::atomic<google::protobuf::internal::ThreadSafeArena::SerialArenaChunk_*>::atomic
            (&this->head_,(__pointer_type)0x0);
  pAVar1 = FirstBlock(this,mem,size,policy);
  SerialArena::SerialArena(&this->first_arena_,pAVar1,this);
  InitializeWithPolicy(this,policy);
  return;
}

Assistant:

ThreadSafeArena::ThreadSafeArena(void* mem, size_t size,
                                 const AllocationPolicy& policy)
    : first_arena_(FirstSerialArena{}, FirstBlock(mem, size, policy), *this) {
  InitializeWithPolicy(policy);
}